

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

size_t __thiscall pfederc::Lexer::getLineNumber(Lexer *this,size_t index)

{
  size_t sVar1;
  const_reference pvVar2;
  Lexer *local_68;
  size_t lineIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t index_local;
  Lexer *this_local;
  
  local_20 = index;
  index_local = (size_t)this;
  if (this->currentEndIndex < index) {
    std::__cxx11::to_string((string *)&lineIndex,index);
    std::operator+(&local_40,"Out of bounds: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineIndex);
    fatal("lexer.cpp",0x46,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&lineIndex);
    this_local = (Lexer *)0x0;
  }
  else {
    local_68 = (Lexer *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                  (&this->lineIndices);
    do {
      sVar1 = local_20;
      local_68 = (Lexer *)((long)&local_68[-1].lastComment.field_2._M_allocated_capacity + 0xf);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->lineIndices,(size_type)local_68);
    } while (sVar1 < *pvVar2);
    this_local = local_68;
  }
  return (size_t)this_local;
}

Assistant:

size_t Lexer::getLineNumber(size_t index) const noexcept {
  if (index > currentEndIndex) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(index));
    return 0;
  }

  size_t lineIndex = lineIndices.size() - 1;
  for (; index < lineIndices[lineIndex]; --lineIndex);

  return lineIndex;
}